

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StopExpressScanThreadRPLIDARx(RPLIDAR *pRPLIDAR)

{
  int local_1c;
  int id;
  RPLIDAR *pRPLIDAR_local;
  
  local_1c = 0;
  do {
    if ((RPLIDAR *)addrsRPLIDAR[local_1c] == pRPLIDAR) {
      bExitExpressScanRPLIDAR[local_1c] = 1;
      WaitForThread(RPLIDARExpressScanThreadId[local_1c]);
      DeleteCriticalSection(RPLIDARCS + local_1c);
      resRPLIDAR[local_1c] = 1;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StopExpressScanThreadRPLIDARx(RPLIDAR* pRPLIDAR)
{
	int id = 0;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitExpressScanRPLIDAR[id] = TRUE;
	WaitForThread(RPLIDARExpressScanThreadId[id]);
	DeleteCriticalSection(&RPLIDARCS[id]);
	resRPLIDAR[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}